

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layernorm_x86.cpp
# Opt level: O0

int __thiscall
ncnn::LayerNorm_x86::forward_inplace(LayerNorm_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  float *pfVar4;
  float *pfVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined8 uVar30;
  long lVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  int iVar34;
  int iVar35;
  long *in_RSI;
  long *in_RDI;
  float fVar36;
  float fVar37;
  float fVar39;
  float fVar40;
  float fVar41;
  undefined1 auVar38 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar45 [16];
  float *ptr_3;
  int q_1;
  float *ptr_2;
  int i_11;
  int q;
  float *ptr_1;
  int i_5;
  float *ptr;
  int elemcount;
  float *beta;
  float *gamma;
  int channels;
  int h;
  int w;
  int elempack;
  int dims;
  __m128 _mean_11;
  __m128 _sqrt_var_3;
  __m128 _var_7;
  __m128 _b_9;
  __m128 _eps_3;
  __m128 _a_9;
  float *b_3;
  float *a_3;
  float var_3 [16];
  float mean_3 [16];
  __m128 _mean_8;
  __m128 _sqrt_var_2;
  __m128 _var_5;
  __m128 _b_6;
  __m128 _eps_2;
  __m128 _a_6;
  float *b_2;
  float *a_2;
  float var_2 [16];
  float mean_2 [16];
  __m128 _mean_5;
  __m128 _sqrt_var_1;
  __m128 _var_3;
  __m128 _b_3;
  __m128 _eps_1;
  __m128 _a_3;
  float *b_1;
  float *a_1;
  float var_1 [16];
  float mean_1 [16];
  __m128 _mean_2;
  __m128 _sqrt_var;
  __m128 _var_1;
  __m128 _b;
  __m128 _eps;
  __m128 _a;
  float *b;
  float *a;
  float var [16];
  float mean [16];
  Mat *m_1;
  Mat *m;
  __m128 _mean;
  float sum;
  __m128 _cur;
  __m128 _sum_128;
  int i;
  __m128 _mean_3;
  float sum_1;
  __m128 _cur_5;
  __m128 _sum_128_1;
  int i_6;
  __m128 _mean_6;
  float sum_2;
  __m128 _cur_10;
  __m128 _sum_128_2;
  int i_12;
  __m128 _mean_9;
  float sum_3;
  __m128 _cur_15;
  __m128 _sum_128_3;
  int i_17;
  __m128 _var;
  float tmp;
  float sq_sum;
  __m128 _cur_1;
  __m128 _sq_sum_128;
  int i_1;
  __m128 _mean_128;
  float _mean_1;
  __m128 _var_2;
  float tmp_1;
  float sq_sum_1;
  __m128 _cur_6;
  __m128 _sq_sum_128_1;
  int i_7;
  __m128 _mean_128_1;
  float _mean_4;
  __m128 _var_4;
  float tmp_2;
  float sq_sum_2;
  __m128 _cur_11;
  __m128 _sq_sum_128_2;
  int i_13;
  __m128 _mean_128_2;
  float _mean_7;
  __m128 _var_6;
  float tmp_3;
  float sq_sum_3;
  __m128 _cur_16;
  __m128 _sq_sum_128_3;
  int i_18;
  __m128 _mean_128_3;
  float _mean_10;
  __m128 _beta_1;
  __m128 _gamma_1;
  __m128 _cur_3;
  __m128 _b_128_1;
  __m128 _a_128_1;
  float _b_1;
  float _a_1;
  int i_3;
  __m128 _beta;
  __m128 _gamma;
  __m128 _cur_2;
  __m128 _b_128;
  __m128 _a_128;
  int i_2;
  __m128 _beta_3;
  __m128 _gamma_3;
  __m128 _cur_8;
  __m128 _b_128_4;
  __m128 _a_128_4;
  float _b_4;
  float _a_4;
  int i_9;
  __m128 _beta_2;
  __m128 _gamma_2;
  __m128 _cur_7;
  __m128 _b_128_3;
  __m128 _a_128_3;
  int i_8;
  __m128 _beta_5;
  __m128 _gamma_5;
  __m128 _cur_13;
  __m128 _b_128_7;
  __m128 _a_128_7;
  float _b_7;
  float _a_7;
  int i_15;
  __m128 _beta_4;
  __m128 _gamma_4;
  __m128 _cur_12;
  __m128 _b_128_6;
  __m128 _a_128_6;
  int i_14;
  __m128 _beta_7;
  __m128 _gamma_7;
  __m128 _cur_18;
  __m128 _b_128_10;
  __m128 _a_128_10;
  float _b_10;
  float _a_10;
  int i_20;
  __m128 _beta_6;
  __m128 _gamma_6;
  __m128 _cur_17;
  __m128 _b_128_9;
  __m128 _a_128_9;
  int i_19;
  __m128 _cur_4;
  int i_4;
  __m128 _b_128_2;
  __m128 _a_128_2;
  float _b_2;
  float _a_2;
  __m128 _cur_9;
  int i_10;
  __m128 _b_128_5;
  __m128 _a_128_5;
  float _b_5;
  float _a_5;
  __m128 _cur_14;
  int i_16;
  __m128 _b_128_8;
  __m128 _a_128_8;
  float _b_8;
  float _a_8;
  __m128 _cur_19;
  int i_21;
  __m128 _b_128_11;
  __m128 _a_128_11;
  float _b_11;
  float _a_11;
  __m128 x32_7;
  __m128 x64_7;
  __m128 x32_5;
  __m128 x64_5;
  __m128 x32_3;
  __m128 x64_3;
  __m128 x32_1;
  __m128 x64_1;
  __m128 x32_6;
  __m128 x64_6;
  __m128 x32_4;
  __m128 x64_4;
  __m128 x32_2;
  __m128 x64_2;
  __m128 x32;
  __m128 x64;
  undefined8 local_3008;
  undefined8 uStack_3000;
  undefined8 local_2fe8;
  undefined8 uStack_2fe0;
  undefined8 local_2f98;
  undefined8 uStack_2f90;
  undefined8 local_2f78;
  undefined8 uStack_2f70;
  undefined8 local_2f28;
  undefined8 uStack_2f20;
  undefined8 local_2f08;
  undefined8 uStack_2f00;
  int local_2e50;
  int local_2df0;
  int local_2dec;
  int local_2ddc;
  undefined8 local_2d48;
  undefined8 uStack_2d40;
  undefined8 local_2d38;
  undefined8 local_2d18;
  undefined8 local_2cf8;
  undefined8 uStack_2cf0;
  undefined8 local_2cb8;
  undefined8 uStack_2cb0;
  undefined8 local_2c28;
  undefined8 uStack_2c20;
  undefined8 local_2c18;
  undefined8 uStack_2c10;
  undefined1 local_2bd8 [16];
  undefined1 local_2b98 [16];
  undefined8 local_2b08;
  undefined8 uStack_2b00;
  undefined8 local_2af8;
  undefined8 uStack_2af0;
  undefined1 local_2ab8 [16];
  undefined1 local_2a78 [16];
  float local_284c;
  float local_2838;
  float fStack_2834;
  float fStack_2830;
  float fStack_282c;
  int local_2828;
  undefined1 (*local_2810) [16];
  float local_27ec;
  undefined8 local_27d8;
  undefined8 uStack_27d0;
  int local_27c8;
  undefined1 (*local_27b0) [16];
  float local_278c;
  undefined8 local_2778;
  undefined8 uStack_2770;
  int local_2768;
  undefined1 (*local_2750) [16];
  undefined8 local_2748;
  undefined8 uStack_2740;
  float local_272c;
  undefined8 local_2718;
  undefined8 uStack_2710;
  int local_2708;
  float *local_26f0;
  float local_26cc;
  float local_26b8;
  float fStack_26b4;
  float fStack_26b0;
  float fStack_26ac;
  int local_269c;
  undefined1 (*local_2660) [16];
  float local_263c;
  undefined8 local_2628;
  undefined8 uStack_2620;
  int local_260c;
  undefined1 (*local_25d0) [16];
  float local_25ac;
  undefined8 local_2598;
  undefined8 uStack_2590;
  int local_257c;
  undefined1 (*local_2540) [16];
  undefined8 local_2538;
  undefined8 uStack_2530;
  float local_251c;
  undefined8 local_2508;
  undefined8 uStack_2500;
  int local_24ec;
  float *local_24b0;
  float local_20c8;
  float fStack_20c4;
  float fStack_20c0;
  float fStack_20bc;
  float local_20b8;
  float fStack_20b4;
  float fStack_20b0;
  float fStack_20ac;
  float local_20a8;
  float fStack_20a4;
  float fStack_20a0;
  float fStack_209c;
  float local_2098;
  float fStack_2094;
  float fStack_2090;
  float fStack_208c;
  float local_2088;
  float fStack_2084;
  float fStack_2080;
  float fStack_207c;
  float local_2078;
  float fStack_2074;
  float fStack_2070;
  float fStack_206c;
  float local_2068;
  float fStack_2064;
  float fStack_2060;
  float fStack_205c;
  float local_2018;
  float fStack_2014;
  float fStack_2010;
  float fStack_200c;
  float local_1ff8;
  float fStack_1ff4;
  float fStack_1ff0;
  float fStack_1fec;
  float local_1fd8;
  float fStack_1fd4;
  float fStack_1fd0;
  float fStack_1fcc;
  undefined8 local_1b88;
  undefined8 uStack_1b80;
  int local_1b4c;
  float *local_1ae0;
  float *local_1ad8;
  undefined1 (*local_1ac0) [16];
  undefined8 local_19a8;
  undefined8 uStack_19a0;
  int local_196c;
  undefined8 local_1948;
  undefined8 uStack_1940;
  int local_190c;
  float *local_1900;
  float *local_18f8;
  undefined1 (*local_18e0) [16];
  undefined8 local_17c8;
  undefined8 uStack_17c0;
  int local_178c;
  undefined8 local_1768;
  undefined8 uStack_1760;
  int local_172c;
  float *local_1720;
  float *local_1718;
  undefined1 (*local_1700) [16];
  undefined8 local_15e8;
  undefined8 uStack_15e0;
  int local_15ac;
  undefined8 local_1588;
  undefined8 uStack_1580;
  int local_154c;
  float *local_1540;
  float *local_1538;
  float *local_1520;
  undefined8 local_1428;
  undefined8 uStack_1420;
  int local_140c;
  undefined1 (*local_13c0) [16];
  undefined8 local_1348;
  undefined8 uStack_1340;
  int local_132c;
  undefined1 (*local_12e0) [16];
  undefined8 local_1268;
  undefined8 uStack_1260;
  int local_124c;
  undefined1 (*local_1200) [16];
  undefined8 local_1188;
  undefined8 uStack_1180;
  int local_116c;
  float *local_1120;
  float local_b28;
  float fStack_b24;
  float fStack_b20;
  float fStack_b1c;
  float local_b18;
  float fStack_b14;
  float fStack_b10;
  float fStack_b0c;
  float local_b08;
  float fStack_b04;
  float fStack_b00;
  float fStack_afc;
  float local_af8;
  float fStack_af4;
  float fStack_af0;
  float fStack_aec;
  float local_ae8;
  float fStack_ae4;
  float fStack_ae0;
  float fStack_adc;
  float local_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float local_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float local_a88;
  float fStack_a84;
  float fStack_a80;
  float fStack_a7c;
  float local_a48;
  float fStack_a44;
  float fStack_a40;
  float fStack_a3c;
  float local_a08;
  float fStack_a04;
  float fStack_a00;
  float fStack_9fc;
  float fStack_944;
  float fStack_940;
  float fStack_93c;
  float local_908;
  float fStack_904;
  float fStack_900;
  float fStack_8fc;
  float fStack_844;
  float fStack_840;
  float fStack_83c;
  float local_808;
  float fStack_804;
  float fStack_800;
  float fStack_7fc;
  float fStack_744;
  float fStack_740;
  float fStack_73c;
  float local_708;
  float fStack_704;
  float fStack_700;
  float fStack_6fc;
  float local_608;
  float fStack_604;
  float fStack_600;
  float fStack_5fc;
  float local_588;
  float fStack_584;
  float fStack_580;
  float fStack_57c;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float fStack_264;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_194;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  
  iVar35 = (int)in_RSI[5];
  iVar1 = (int)in_RSI[3];
  iVar2 = *(int *)((long)in_RSI + 0x2c);
  iVar3 = (int)in_RSI[6];
  lVar31 = in_RSI[7];
  pfVar4 = *(float **)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0);
  pfVar5 = *(float **)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x128);
  if (iVar35 == 1) {
    iVar34 = iVar2 * iVar1;
    local_1ac0 = (undefined1 (*) [16])*in_RSI;
    local_2838 = 0.0;
    fStack_2834 = 0.0;
    fStack_2830 = 0.0;
    fStack_282c = 0.0;
    local_2810 = local_1ac0;
    for (local_2828 = 0; local_2828 + 4 <= iVar34; local_2828 = local_2828 + 4) {
      local_2068 = (float)*(undefined8 *)*local_2810;
      fStack_2064 = (float)((ulong)*(undefined8 *)*local_2810 >> 0x20);
      fStack_2060 = (float)*(undefined8 *)(*local_2810 + 8);
      fStack_205c = (float)((ulong)*(undefined8 *)(*local_2810 + 8) >> 0x20);
      local_2838 = local_2838 + local_2068;
      fStack_2834 = fStack_2834 + fStack_2064;
      fStack_2830 = fStack_2830 + fStack_2060;
      fStack_282c = fStack_282c + fStack_205c;
      local_2810 = local_2810 + 1;
    }
    local_284c = 0.0;
    for (; local_2828 < iVar34; local_2828 = local_2828 + 1) {
      local_284c = *(float *)*local_2810 + local_284c;
      local_2810 = (undefined1 (*) [16])(*local_2810 + 4);
    }
    fVar36 = (local_2838 + fStack_2830 + fStack_2834 + fStack_282c + local_284c) / (float)iVar34;
    local_26b8 = 0.0;
    fStack_26b4 = 0.0;
    fStack_26b0 = 0.0;
    fStack_26ac = 0.0;
    local_2660 = local_1ac0;
    for (local_269c = 0; local_269c + 4 <= iVar34; local_269c = local_269c + 4) {
      local_ab8 = (float)*(undefined8 *)*local_2660;
      fStack_ab4 = (float)((ulong)*(undefined8 *)*local_2660 >> 0x20);
      fStack_ab0 = (float)*(undefined8 *)(*local_2660 + 8);
      fStack_aac = (float)((ulong)*(undefined8 *)(*local_2660 + 8) >> 0x20);
      local_26b8 = (local_ab8 - fVar36) * (local_ab8 - fVar36) + local_26b8;
      fStack_26b4 = (fStack_ab4 - fVar36) * (fStack_ab4 - fVar36) + fStack_26b4;
      fStack_26b0 = (fStack_ab0 - fVar36) * (fStack_ab0 - fVar36) + fStack_26b0;
      fStack_26ac = (fStack_aac - fVar36) * (fStack_aac - fVar36) + fStack_26ac;
      local_2660 = local_2660 + 1;
    }
    local_26cc = 0.0;
    for (; local_269c < iVar34; local_269c = local_269c + 1) {
      fVar37 = *(float *)*local_2660 - fVar36;
      local_26cc = fVar37 * fVar37 + local_26cc;
      local_2660 = (undefined1 (*) [16])(*local_2660 + 4);
    }
    fVar37 = 1.0 / SQRT((local_26b8 + fStack_26b0 + fStack_26b4 + fStack_26ac + local_26cc) /
                        (float)iVar34 + *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4)
                       );
    fVar36 = -fVar36 * fVar37;
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 0) {
      local_13c0 = local_1ac0;
      for (local_140c = 0; local_140c + 4 <= iVar34; local_140c = local_140c + 4) {
        local_218 = (float)*(undefined8 *)*local_13c0;
        fStack_214 = (float)((ulong)*(undefined8 *)*local_13c0 >> 0x20);
        fStack_210 = (float)*(undefined8 *)(*local_13c0 + 8);
        fStack_20c = (float)((ulong)*(undefined8 *)(*local_13c0 + 8) >> 0x20);
        local_1428 = CONCAT44(fStack_214 * fVar37 + fVar36,local_218 * fVar37 + fVar36);
        uStack_1420 = CONCAT44(fStack_20c * fVar37 + fVar36,fStack_210 * fVar37 + fVar36);
        auVar38._8_8_ = uStack_1420;
        auVar38._0_8_ = local_1428;
        *local_13c0 = auVar38;
        local_13c0 = local_13c0 + 1;
      }
      for (; local_140c < iVar34; local_140c = local_140c + 1) {
        *(float *)*local_13c0 = *(float *)*local_13c0 * fVar37 + fVar36;
        local_13c0 = (undefined1 (*) [16])(*local_13c0 + 4);
      }
    }
    else {
      local_1ae0 = pfVar5;
      local_1ad8 = pfVar4;
      for (local_1b4c = 0; local_1b4c + 4 <= iVar34; local_1b4c = local_1b4c + 4) {
        local_418 = (float)*(undefined8 *)*local_1ac0;
        fStack_414 = (float)((ulong)*(undefined8 *)*local_1ac0 >> 0x20);
        fStack_410 = (float)*(undefined8 *)(*local_1ac0 + 8);
        fStack_40c = (float)((ulong)*(undefined8 *)(*local_1ac0 + 8) >> 0x20);
        local_408 = (float)*(undefined8 *)local_1ad8;
        fStack_404 = (float)((ulong)*(undefined8 *)local_1ad8 >> 0x20);
        fStack_400 = (float)*(undefined8 *)(local_1ad8 + 2);
        fStack_3fc = (float)((ulong)*(undefined8 *)(local_1ad8 + 2) >> 0x20);
        local_608 = (float)*(undefined8 *)local_1ae0;
        fStack_604 = (float)((ulong)*(undefined8 *)local_1ae0 >> 0x20);
        fStack_600 = (float)*(undefined8 *)(local_1ae0 + 2);
        fStack_5fc = (float)((ulong)*(undefined8 *)(local_1ae0 + 2) >> 0x20);
        local_1b88 = CONCAT44((fStack_414 * fVar37 + fVar36) * fStack_404 + fStack_604,
                              (local_418 * fVar37 + fVar36) * local_408 + local_608);
        uStack_1b80 = CONCAT44((fStack_40c * fVar37 + fVar36) * fStack_3fc + fStack_5fc,
                               (fStack_410 * fVar37 + fVar36) * fStack_400 + fStack_600);
        auVar45._8_8_ = uStack_1b80;
        auVar45._0_8_ = local_1b88;
        *local_1ac0 = auVar45;
        local_1ac0 = local_1ac0 + 1;
        local_1ad8 = local_1ad8 + 4;
        local_1ae0 = local_1ae0 + 4;
      }
      for (; local_1b4c < iVar34; local_1b4c = local_1b4c + 1) {
        *(float *)*local_1ac0 =
             (*(float *)*local_1ac0 * fVar37 + fVar36) * *local_1ad8 + *local_1ae0;
        local_1ac0 = (undefined1 (*) [16])(*local_1ac0 + 4);
        local_1ad8 = local_1ad8 + 1;
        local_1ae0 = local_1ae0 + 1;
      }
    }
  }
  if (iVar35 == 2) {
    for (local_2ddc = 0; local_2ddc < iVar3; local_2ddc = local_2ddc + 1) {
      local_18e0 = (undefined1 (*) [16])
                   (*in_RSI + (long)*(int *)((long)in_RSI + 0x2c) * (long)local_2ddc * in_RSI[2]);
      iVar34 = iVar2 * iVar1;
      fVar36 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
      local_2a78 = ZEXT816(0);
      local_2ab8 = ZEXT816(0);
      local_27c8 = 0;
      local_27d8 = 0;
      uStack_27d0 = 0;
      local_27b0 = local_18e0;
      while( true ) {
        local_2078 = (float)local_27d8;
        fStack_2074 = (float)((ulong)local_27d8 >> 0x20);
        fStack_2070 = (float)uStack_27d0;
        fStack_206c = (float)((ulong)uStack_27d0 >> 0x20);
        if (iVar34 < local_27c8 + 4) break;
        local_2088 = (float)*(undefined8 *)*local_27b0;
        fStack_2084 = (float)((ulong)*(undefined8 *)*local_27b0 >> 0x20);
        fStack_2080 = (float)*(undefined8 *)(*local_27b0 + 8);
        fStack_207c = (float)((ulong)*(undefined8 *)(*local_27b0 + 8) >> 0x20);
        local_27d8 = CONCAT44(fStack_2074 + fStack_2084,local_2078 + local_2088);
        uStack_27d0 = CONCAT44(fStack_206c + fStack_207c,fStack_2070 + fStack_2080);
        local_27c8 = local_27c8 + 4;
        local_27b0 = local_27b0 + 1;
      }
      local_27ec = 0.0;
      for (; local_27c8 < iVar34; local_27c8 = local_27c8 + 1) {
        local_27ec = *(float *)*local_27b0 + local_27ec;
        local_27b0 = (undefined1 (*) [16])(*local_27b0 + 4);
      }
      if (iVar1 == 4) {
        fVar37 = (float)iVar2;
        auVar16._4_4_ = fVar37;
        auVar16._0_4_ = fVar37;
        auVar16._12_4_ = fVar37;
        auVar16._8_4_ = fVar37;
        auVar17._8_8_ = uStack_27d0;
        auVar17._0_8_ = local_27d8;
        local_2a78 = divps(auVar17,auVar16);
      }
      auVar38 = local_2a78;
      uStack_2f00 = local_2a78._8_8_;
      if (iVar1 == 1) {
        local_2a78._0_4_ =
             (local_2078 + fStack_2070 + fStack_2074 + fStack_206c + local_27ec) / (float)iVar2;
      }
      local_2f08 = local_2a78._0_8_;
      if (iVar1 == 4) {
      }
      else {
        local_2f08 = CONCAT44(local_2a78._0_4_,local_2a78._0_4_);
        uStack_2f00 = CONCAT44(local_2a78._0_4_,local_2a78._0_4_);
      }
      local_260c = 0;
      local_2628 = 0;
      uStack_2620 = 0;
      local_25d0 = local_18e0;
      while( true ) {
        local_508 = (float)local_2628;
        fStack_504 = (float)((ulong)local_2628 >> 0x20);
        fStack_500 = (float)uStack_2620;
        fStack_4fc = (float)((ulong)uStack_2620 >> 0x20);
        if (iVar34 < local_260c + 4) break;
        local_ad8 = (float)*(undefined8 *)*local_25d0;
        fStack_ad4 = (float)((ulong)*(undefined8 *)*local_25d0 >> 0x20);
        fStack_ad0 = (float)*(undefined8 *)(*local_25d0 + 8);
        fStack_acc = (float)((ulong)*(undefined8 *)(*local_25d0 + 8) >> 0x20);
        local_ae8 = (float)local_2f08;
        fStack_ae4 = (float)((ulong)local_2f08 >> 0x20);
        fStack_ae0 = (float)uStack_2f00;
        fStack_adc = (float)((ulong)uStack_2f00 >> 0x20);
        local_2628 = CONCAT44((fStack_ad4 - fStack_ae4) * (fStack_ad4 - fStack_ae4) + fStack_504,
                              (local_ad8 - local_ae8) * (local_ad8 - local_ae8) + local_508);
        uStack_2620 = CONCAT44((fStack_acc - fStack_adc) * (fStack_acc - fStack_adc) + fStack_4fc,
                               (fStack_ad0 - fStack_ae0) * (fStack_ad0 - fStack_ae0) + fStack_500);
        local_260c = local_260c + 4;
        local_25d0 = local_25d0 + 1;
      }
      local_263c = 0.0;
      for (; local_260c < iVar34; local_260c = local_260c + 1) {
        fVar37 = *(float *)*local_25d0 - (float)local_2a78._0_4_;
        local_263c = fVar37 * fVar37 + local_263c;
        local_25d0 = (undefined1 (*) [16])(*local_25d0 + 4);
      }
      if (iVar1 == 4) {
        fVar37 = (float)iVar2;
        auVar10._4_4_ = fVar37;
        auVar10._0_4_ = fVar37;
        auVar10._12_4_ = fVar37;
        auVar10._8_4_ = fVar37;
        auVar11._8_8_ = uStack_2620;
        auVar11._0_8_ = local_2628;
        local_2ab8 = divps(auVar11,auVar10);
      }
      if (iVar1 == 1) {
        local_2ab8._0_4_ =
             (local_508 + fStack_500 + fStack_504 + fStack_4fc + local_263c) / (float)iVar2;
      }
      if (iVar1 == 4) {
        local_2018 = local_2ab8._0_4_;
        fStack_2014 = local_2ab8._4_4_;
        fStack_2010 = local_2ab8._8_4_;
        fStack_200c = local_2ab8._12_4_;
        local_2b08 = CONCAT44(fStack_2014 + fVar36,local_2018 + fVar36);
        uStack_2b00 = CONCAT44(fStack_200c + fVar36,fStack_2010 + fVar36);
        auVar42._8_8_ = uStack_2b00;
        auVar42._0_8_ = local_2b08;
        auVar45 = rsqrtps(in_XMM3,auVar42);
        fVar37 = (local_2018 + fVar36) * auVar45._0_4_;
        fVar39 = (fStack_2014 + fVar36) * auVar45._4_4_;
        fVar40 = (fStack_2010 + fVar36) * auVar45._8_4_;
        fVar41 = (fStack_200c + fVar36) * auVar45._12_4_;
        auVar42 = auVar42 & _DAT_01c87220;
        auVar18._4_4_ =
             -(uint)(1.1754944e-38 <= auVar42._4_4_) &
             (uint)(fVar39 * -0.5 * (fVar39 * auVar45._4_4_ + DAT_01c8b920._4_4_));
        auVar18._0_4_ =
             -(uint)(1.1754944e-38 <= auVar42._0_4_) &
             (uint)(fVar37 * -0.5 * (fVar37 * auVar45._0_4_ + (float)DAT_01c8b920));
        auVar18._12_4_ =
             -(uint)(1.1754944e-38 <= auVar42._12_4_) &
             (uint)(fVar41 * -0.5 * (fVar41 * auVar45._12_4_ + DAT_01c8b920._12_4_));
        auVar18._8_4_ =
             -(uint)(1.1754944e-38 <= auVar42._8_4_) &
             (uint)(fVar40 * -0.5 * (fVar40 * auVar45._8_4_ + DAT_01c8b920._8_4_));
        auVar19._8_8_ = 0x3f8000003f800000;
        auVar19._0_8_ = 0x3f8000003f800000;
        local_2ab8 = divps(auVar19,auVar18);
        fStack_154 = local_2a78._4_4_;
        fStack_150 = auVar38._8_4_;
        fStack_14c = auVar38._12_4_;
        local_168 = local_2ab8._0_4_;
        fStack_164 = local_2ab8._4_4_;
        fStack_160 = local_2ab8._8_4_;
        fStack_15c = local_2ab8._12_4_;
        local_2af8 = CONCAT44(0.0 - fStack_154 * fStack_164,
                              0.0 - (float)local_2a78._0_4_ * local_168);
        uStack_2af0 = CONCAT44(0.0 - fStack_14c * fStack_15c,0.0 - fStack_150 * fStack_160);
        local_2a78._8_8_ = uStack_2af0;
        local_2a78._0_8_ = local_2af8;
        in_XMM3 = _DAT_01c8b920;
      }
      if (iVar1 == 1) {
        fVar36 = 1.0 / SQRT((float)local_2ab8._0_4_ + fVar36);
        local_2ab8._0_4_ = fVar36;
        local_2a78._0_4_ = -(float)local_2a78._0_4_ * fVar36;
      }
      uVar32 = local_2ab8._0_4_;
      uVar33 = local_2a78._0_4_;
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 0) {
        if (iVar1 == 4) {
          local_2f28 = local_2a78._0_8_;
          uStack_2f20 = local_2a78._8_8_;
        }
        else {
          local_2ab8._0_8_ = CONCAT44(uVar32,uVar32);
          local_2ab8._8_8_ = CONCAT44(uVar32,uVar32);
          local_2f28 = CONCAT44(local_2a78._0_4_,local_2a78._0_4_);
          uStack_2f20 = CONCAT44(local_2a78._0_4_,local_2a78._0_4_);
        }
        local_12e0 = local_18e0;
        for (local_132c = 0; local_132c + 4 <= iVar34; local_132c = local_132c + 4) {
          local_1f8 = (float)*(undefined8 *)*local_12e0;
          fStack_1f4 = (float)((ulong)*(undefined8 *)*local_12e0 >> 0x20);
          fStack_1f0 = (float)*(undefined8 *)(*local_12e0 + 8);
          fStack_1ec = (float)((ulong)*(undefined8 *)(*local_12e0 + 8) >> 0x20);
          local_208 = (float)local_2ab8._0_8_;
          fStack_204 = (float)((ulong)local_2ab8._0_8_ >> 0x20);
          fStack_200 = (float)local_2ab8._8_8_;
          fStack_1fc = (float)((ulong)local_2ab8._8_8_ >> 0x20);
          local_a08 = (float)local_2f28;
          fStack_a04 = (float)((ulong)local_2f28 >> 0x20);
          fStack_a00 = (float)uStack_2f20;
          fStack_9fc = (float)((ulong)uStack_2f20 >> 0x20);
          local_1348 = CONCAT44(fStack_1f4 * fStack_204 + fStack_a04,
                                local_1f8 * local_208 + local_a08);
          uStack_1340 = CONCAT44(fStack_1ec * fStack_1fc + fStack_9fc,
                                 fStack_1f0 * fStack_200 + fStack_a00);
          auVar28._8_8_ = uStack_1340;
          auVar28._0_8_ = local_1348;
          *local_12e0 = auVar28;
          local_12e0 = local_12e0 + 1;
        }
        for (; local_132c < iVar34; local_132c = local_132c + 1) {
          *(float *)*local_12e0 = *(float *)*local_12e0 * (float)uVar32 + (float)uVar33;
          local_12e0 = (undefined1 (*) [16])(*local_12e0 + 4);
        }
      }
      else {
        local_1900 = pfVar5;
        local_18f8 = pfVar4;
        if (iVar1 == 4) {
          for (local_190c = 0; local_190c + 4 <= iVar34; local_190c = local_190c + 4) {
            fVar36 = *local_18f8;
            fVar37 = *local_1900;
            local_358 = (float)*(undefined8 *)*local_18e0;
            fStack_354 = (float)((ulong)*(undefined8 *)*local_18e0 >> 0x20);
            fStack_350 = (float)*(undefined8 *)(*local_18e0 + 8);
            fStack_34c = (float)((ulong)*(undefined8 *)(*local_18e0 + 8) >> 0x20);
            fStack_364 = local_2ab8._4_4_;
            fStack_360 = local_2ab8._8_4_;
            fStack_35c = local_2ab8._12_4_;
            fStack_744 = local_2a78._4_4_;
            fStack_740 = local_2a78._8_4_;
            fStack_73c = local_2a78._12_4_;
            local_1948 = CONCAT44((fStack_354 * fStack_364 + fStack_744) * fVar36 + fVar37,
                                  (local_358 * (float)uVar32 + (float)local_2a78._0_4_) * fVar36 +
                                  fVar37);
            uStack_1940 = CONCAT44((fStack_34c * fStack_35c + fStack_73c) * fVar36 + fVar37,
                                   (fStack_350 * fStack_360 + fStack_740) * fVar36 + fVar37);
            auVar25._8_8_ = uStack_1940;
            auVar25._0_8_ = local_1948;
            *local_18e0 = auVar25;
            local_18e0 = local_18e0 + 1;
            local_18f8 = local_18f8 + 1;
            local_1900 = local_1900 + 1;
          }
        }
        if (iVar1 == 1) {
          for (local_196c = 0; local_196c + 4 <= iVar34; local_196c = local_196c + 4) {
            local_398 = (float)*(undefined8 *)*local_18e0;
            fStack_394 = (float)((ulong)*(undefined8 *)*local_18e0 >> 0x20);
            fStack_390 = (float)*(undefined8 *)(*local_18e0 + 8);
            fStack_38c = (float)((ulong)*(undefined8 *)(*local_18e0 + 8) >> 0x20);
            local_388 = (float)*(undefined8 *)local_18f8;
            fStack_384 = (float)((ulong)*(undefined8 *)local_18f8 >> 0x20);
            fStack_380 = (float)*(undefined8 *)(local_18f8 + 2);
            fStack_37c = (float)((ulong)*(undefined8 *)(local_18f8 + 2) >> 0x20);
            local_708 = (float)*(undefined8 *)local_1900;
            fStack_704 = (float)((ulong)*(undefined8 *)local_1900 >> 0x20);
            fStack_700 = (float)*(undefined8 *)(local_1900 + 2);
            fStack_6fc = (float)((ulong)*(undefined8 *)(local_1900 + 2) >> 0x20);
            local_19a8 = CONCAT44((fStack_394 * (float)uVar32 + (float)local_2a78._0_4_) *
                                  fStack_384 + fStack_704,
                                  (local_398 * (float)uVar32 + (float)local_2a78._0_4_) * local_388
                                  + local_708);
            uStack_19a0 = CONCAT44((fStack_38c * (float)uVar32 + (float)local_2a78._0_4_) *
                                   fStack_37c + fStack_6fc,
                                   (fStack_390 * (float)uVar32 + (float)local_2a78._0_4_) *
                                   fStack_380 + fStack_700);
            auVar24._8_8_ = uStack_19a0;
            auVar24._0_8_ = local_19a8;
            *local_18e0 = auVar24;
            local_18e0 = local_18e0 + 1;
            local_18f8 = local_18f8 + 4;
            local_1900 = local_1900 + 4;
          }
          for (; local_196c < iVar34; local_196c = local_196c + 1) {
            *(float *)*local_18e0 =
                 (*(float *)*local_18e0 * (float)uVar32 + (float)local_2a78._0_4_) * *local_18f8 +
                 *local_1900;
            local_18e0 = (undefined1 (*) [16])(*local_18e0 + 4);
            local_18f8 = local_18f8 + 1;
            local_1900 = local_1900 + 1;
          }
        }
      }
    }
  }
  if (iVar35 == 3) {
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == iVar2) {
      for (local_2dec = 0; local_2dec < (int)lVar31; local_2dec = local_2dec + 1) {
        for (local_2df0 = 0; local_2df0 < iVar3; local_2df0 = local_2df0 + 1) {
          local_1700 = (undefined1 (*) [16])
                       (*in_RSI + in_RSI[8] * (long)local_2dec * in_RSI[2] +
                       (long)*(int *)((long)in_RSI + 0x2c) * (long)local_2df0 * in_RSI[2]);
          iVar35 = iVar2 * iVar1;
          fVar36 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
          local_2b98 = ZEXT816(0);
          local_2bd8 = ZEXT816(0);
          local_2768 = 0;
          local_2778 = 0;
          uStack_2770 = 0;
          local_2750 = local_1700;
          while( true ) {
            local_2098 = (float)local_2778;
            fStack_2094 = (float)((ulong)local_2778 >> 0x20);
            fStack_2090 = (float)uStack_2770;
            fStack_208c = (float)((ulong)uStack_2770 >> 0x20);
            if (iVar35 < local_2768 + 4) break;
            local_20a8 = (float)*(undefined8 *)*local_2750;
            fStack_20a4 = (float)((ulong)*(undefined8 *)*local_2750 >> 0x20);
            fStack_20a0 = (float)*(undefined8 *)(*local_2750 + 8);
            fStack_209c = (float)((ulong)*(undefined8 *)(*local_2750 + 8) >> 0x20);
            local_2778 = CONCAT44(fStack_2094 + fStack_20a4,local_2098 + local_20a8);
            uStack_2770 = CONCAT44(fStack_208c + fStack_209c,fStack_2090 + fStack_20a0);
            local_2768 = local_2768 + 4;
            local_2750 = local_2750 + 1;
          }
          local_278c = 0.0;
          for (; local_2768 < iVar35; local_2768 = local_2768 + 1) {
            local_278c = *(float *)*local_2750 + local_278c;
            local_2750 = (undefined1 (*) [16])(*local_2750 + 4);
          }
          if (iVar1 == 4) {
            fVar37 = (float)iVar2;
            auVar14._4_4_ = fVar37;
            auVar14._0_4_ = fVar37;
            auVar14._12_4_ = fVar37;
            auVar14._8_4_ = fVar37;
            auVar15._8_8_ = uStack_2770;
            auVar15._0_8_ = local_2778;
            local_2b98 = divps(auVar15,auVar14);
          }
          auVar38 = local_2b98;
          uStack_2f70 = local_2b98._8_8_;
          if (iVar1 == 1) {
            local_2b98._0_4_ =
                 (local_2098 + fStack_2090 + fStack_2094 + fStack_208c + local_278c) / (float)iVar2;
          }
          local_2f78 = local_2b98._0_8_;
          if (iVar1 == 4) {
          }
          else {
            local_2f78 = CONCAT44(local_2b98._0_4_,local_2b98._0_4_);
            uStack_2f70 = CONCAT44(local_2b98._0_4_,local_2b98._0_4_);
          }
          local_257c = 0;
          local_2598 = 0;
          uStack_2590 = 0;
          local_2540 = local_1700;
          while( true ) {
            local_548 = (float)local_2598;
            fStack_544 = (float)((ulong)local_2598 >> 0x20);
            fStack_540 = (float)uStack_2590;
            fStack_53c = (float)((ulong)uStack_2590 >> 0x20);
            if (iVar35 < local_257c + 4) break;
            local_af8 = (float)*(undefined8 *)*local_2540;
            fStack_af4 = (float)((ulong)*(undefined8 *)*local_2540 >> 0x20);
            fStack_af0 = (float)*(undefined8 *)(*local_2540 + 8);
            fStack_aec = (float)((ulong)*(undefined8 *)(*local_2540 + 8) >> 0x20);
            local_b08 = (float)local_2f78;
            fStack_b04 = (float)((ulong)local_2f78 >> 0x20);
            fStack_b00 = (float)uStack_2f70;
            fStack_afc = (float)((ulong)uStack_2f70 >> 0x20);
            local_2598 = CONCAT44((fStack_af4 - fStack_b04) * (fStack_af4 - fStack_b04) + fStack_544
                                  ,(local_af8 - local_b08) * (local_af8 - local_b08) + local_548);
            uStack_2590 = CONCAT44((fStack_aec - fStack_afc) * (fStack_aec - fStack_afc) +
                                   fStack_53c,
                                   (fStack_af0 - fStack_b00) * (fStack_af0 - fStack_b00) +
                                   fStack_540);
            local_257c = local_257c + 4;
            local_2540 = local_2540 + 1;
          }
          local_25ac = 0.0;
          for (; local_257c < iVar35; local_257c = local_257c + 1) {
            fVar37 = *(float *)*local_2540 - (float)local_2b98._0_4_;
            local_25ac = fVar37 * fVar37 + local_25ac;
            local_2540 = (undefined1 (*) [16])(*local_2540 + 4);
          }
          if (iVar1 == 4) {
            fVar37 = (float)iVar2;
            auVar8._4_4_ = fVar37;
            auVar8._0_4_ = fVar37;
            auVar8._12_4_ = fVar37;
            auVar8._8_4_ = fVar37;
            auVar9._8_8_ = uStack_2590;
            auVar9._0_8_ = local_2598;
            local_2bd8 = divps(auVar9,auVar8);
          }
          if (iVar1 == 1) {
            local_2bd8._0_4_ =
                 (local_548 + fStack_540 + fStack_544 + fStack_53c + local_25ac) / (float)iVar2;
          }
          if (iVar1 == 4) {
            local_1ff8 = local_2bd8._0_4_;
            fStack_1ff4 = local_2bd8._4_4_;
            fStack_1ff0 = local_2bd8._8_4_;
            fStack_1fec = local_2bd8._12_4_;
            local_2c28 = CONCAT44(fStack_1ff4 + fVar36,local_1ff8 + fVar36);
            uStack_2c20 = CONCAT44(fStack_1fec + fVar36,fStack_1ff0 + fVar36);
            auVar43._8_8_ = uStack_2c20;
            auVar43._0_8_ = local_2c28;
            auVar45 = rsqrtps(in_XMM3,auVar43);
            fVar37 = (local_1ff8 + fVar36) * auVar45._0_4_;
            fVar39 = (fStack_1ff4 + fVar36) * auVar45._4_4_;
            fVar40 = (fStack_1ff0 + fVar36) * auVar45._8_4_;
            fVar41 = (fStack_1fec + fVar36) * auVar45._12_4_;
            auVar43 = auVar43 & _DAT_01c87220;
            auVar20._4_4_ =
                 -(uint)(1.1754944e-38 <= auVar43._4_4_) &
                 (uint)(fVar39 * -0.5 * (fVar39 * auVar45._4_4_ + DAT_01c8b920._4_4_));
            auVar20._0_4_ =
                 -(uint)(1.1754944e-38 <= auVar43._0_4_) &
                 (uint)(fVar37 * -0.5 * (fVar37 * auVar45._0_4_ + (float)DAT_01c8b920));
            auVar20._12_4_ =
                 -(uint)(1.1754944e-38 <= auVar43._12_4_) &
                 (uint)(fVar41 * -0.5 * (fVar41 * auVar45._12_4_ + DAT_01c8b920._12_4_));
            auVar20._8_4_ =
                 -(uint)(1.1754944e-38 <= auVar43._8_4_) &
                 (uint)(fVar40 * -0.5 * (fVar40 * auVar45._8_4_ + DAT_01c8b920._8_4_));
            auVar21._8_8_ = 0x3f8000003f800000;
            auVar21._0_8_ = 0x3f8000003f800000;
            local_2bd8 = divps(auVar21,auVar20);
            fStack_174 = local_2b98._4_4_;
            fStack_170 = auVar38._8_4_;
            fStack_16c = auVar38._12_4_;
            local_188 = local_2bd8._0_4_;
            fStack_184 = local_2bd8._4_4_;
            fStack_180 = local_2bd8._8_4_;
            fStack_17c = local_2bd8._12_4_;
            local_2c18 = CONCAT44(0.0 - fStack_174 * fStack_184,
                                  0.0 - (float)local_2b98._0_4_ * local_188);
            uStack_2c10 = CONCAT44(0.0 - fStack_16c * fStack_17c,0.0 - fStack_170 * fStack_180);
            local_2b98._8_8_ = uStack_2c10;
            local_2b98._0_8_ = local_2c18;
            in_XMM3 = _DAT_01c8b920;
          }
          if (iVar1 == 1) {
            fVar36 = 1.0 / SQRT((float)local_2bd8._0_4_ + fVar36);
            local_2bd8._0_4_ = fVar36;
            local_2b98._0_4_ = -(float)local_2b98._0_4_ * fVar36;
          }
          uVar32 = local_2bd8._0_4_;
          uVar33 = local_2b98._0_4_;
          if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 0) {
            if (iVar1 == 4) {
              local_2f98 = local_2b98._0_8_;
              uStack_2f90 = local_2b98._8_8_;
            }
            else {
              local_2bd8._0_8_ = CONCAT44(uVar32,uVar32);
              local_2bd8._8_8_ = CONCAT44(uVar32,uVar32);
              local_2f98 = CONCAT44(local_2b98._0_4_,local_2b98._0_4_);
              uStack_2f90 = CONCAT44(local_2b98._0_4_,local_2b98._0_4_);
            }
            local_1200 = local_1700;
            for (local_124c = 0; local_124c + 4 <= iVar35; local_124c = local_124c + 4) {
              local_1d8 = (float)*(undefined8 *)*local_1200;
              fStack_1d4 = (float)((ulong)*(undefined8 *)*local_1200 >> 0x20);
              fStack_1d0 = (float)*(undefined8 *)(*local_1200 + 8);
              fStack_1cc = (float)((ulong)*(undefined8 *)(*local_1200 + 8) >> 0x20);
              local_1e8 = (float)local_2bd8._0_8_;
              fStack_1e4 = (float)((ulong)local_2bd8._0_8_ >> 0x20);
              fStack_1e0 = (float)local_2bd8._8_8_;
              fStack_1dc = (float)((ulong)local_2bd8._8_8_ >> 0x20);
              local_a48 = (float)local_2f98;
              fStack_a44 = (float)((ulong)local_2f98 >> 0x20);
              fStack_a40 = (float)uStack_2f90;
              fStack_a3c = (float)((ulong)uStack_2f90 >> 0x20);
              local_1268 = CONCAT44(fStack_1d4 * fStack_1e4 + fStack_a44,
                                    local_1d8 * local_1e8 + local_a48);
              uStack_1260 = CONCAT44(fStack_1cc * fStack_1dc + fStack_a3c,
                                     fStack_1d0 * fStack_1e0 + fStack_a40);
              auVar29._8_8_ = uStack_1260;
              auVar29._0_8_ = local_1268;
              *local_1200 = auVar29;
              local_1200 = local_1200 + 1;
            }
            for (; local_124c < iVar35; local_124c = local_124c + 1) {
              *(float *)*local_1200 = *(float *)*local_1200 * (float)uVar32 + (float)uVar33;
              local_1200 = (undefined1 (*) [16])(*local_1200 + 4);
            }
          }
          else {
            local_1720 = pfVar5;
            local_1718 = pfVar4;
            if (iVar1 == 4) {
              for (local_172c = 0; local_172c + 4 <= iVar35; local_172c = local_172c + 4) {
                fVar36 = *local_1718;
                fVar37 = *local_1720;
                local_2d8 = (float)*(undefined8 *)*local_1700;
                fStack_2d4 = (float)((ulong)*(undefined8 *)*local_1700 >> 0x20);
                fStack_2d0 = (float)*(undefined8 *)(*local_1700 + 8);
                fStack_2cc = (float)((ulong)*(undefined8 *)(*local_1700 + 8) >> 0x20);
                fStack_2e4 = local_2bd8._4_4_;
                fStack_2e0 = local_2bd8._8_4_;
                fStack_2dc = local_2bd8._12_4_;
                fStack_844 = local_2b98._4_4_;
                fStack_840 = local_2b98._8_4_;
                fStack_83c = local_2b98._12_4_;
                local_1768 = CONCAT44((fStack_2d4 * fStack_2e4 + fStack_844) * fVar36 + fVar37,
                                      (local_2d8 * (float)uVar32 + (float)local_2b98._0_4_) * fVar36
                                      + fVar37);
                uStack_1760 = CONCAT44((fStack_2cc * fStack_2dc + fStack_83c) * fVar36 + fVar37,
                                       (fStack_2d0 * fStack_2e0 + fStack_840) * fVar36 + fVar37);
                auVar27._8_8_ = uStack_1760;
                auVar27._0_8_ = local_1768;
                *local_1700 = auVar27;
                local_1700 = local_1700 + 1;
                local_1718 = local_1718 + 1;
                local_1720 = local_1720 + 1;
              }
            }
            if (iVar1 == 1) {
              for (local_178c = 0; local_178c + 4 <= iVar35; local_178c = local_178c + 4) {
                local_318 = (float)*(undefined8 *)*local_1700;
                fStack_314 = (float)((ulong)*(undefined8 *)*local_1700 >> 0x20);
                fStack_310 = (float)*(undefined8 *)(*local_1700 + 8);
                fStack_30c = (float)((ulong)*(undefined8 *)(*local_1700 + 8) >> 0x20);
                local_308 = (float)*(undefined8 *)local_1718;
                fStack_304 = (float)((ulong)*(undefined8 *)local_1718 >> 0x20);
                fStack_300 = (float)*(undefined8 *)(local_1718 + 2);
                fStack_2fc = (float)((ulong)*(undefined8 *)(local_1718 + 2) >> 0x20);
                local_808 = (float)*(undefined8 *)local_1720;
                fStack_804 = (float)((ulong)*(undefined8 *)local_1720 >> 0x20);
                fStack_800 = (float)*(undefined8 *)(local_1720 + 2);
                fStack_7fc = (float)((ulong)*(undefined8 *)(local_1720 + 2) >> 0x20);
                local_17c8 = CONCAT44((fStack_314 * (float)uVar32 + (float)local_2b98._0_4_) *
                                      fStack_304 + fStack_804,
                                      (local_318 * (float)uVar32 + (float)local_2b98._0_4_) *
                                      local_308 + local_808);
                uStack_17c0 = CONCAT44((fStack_30c * (float)uVar32 + (float)local_2b98._0_4_) *
                                       fStack_2fc + fStack_7fc,
                                       (fStack_310 * (float)uVar32 + (float)local_2b98._0_4_) *
                                       fStack_300 + fStack_800);
                auVar26._8_8_ = uStack_17c0;
                auVar26._0_8_ = local_17c8;
                *local_1700 = auVar26;
                local_1700 = local_1700 + 1;
                local_1718 = local_1718 + 4;
                local_1720 = local_1720 + 4;
              }
              for (; local_178c < iVar35; local_178c = local_178c + 1) {
                *(float *)*local_1700 =
                     (*(float *)*local_1700 * (float)uVar32 + (float)local_2b98._0_4_) * *local_1718
                     + *local_1720;
                local_1700 = (undefined1 (*) [16])(*local_1700 + 4);
                local_1718 = local_1718 + 1;
                local_1720 = local_1720 + 1;
              }
            }
          }
        }
      }
    }
    else {
      for (local_2e50 = 0; local_2e50 < (int)lVar31; local_2e50 = local_2e50 + 1) {
        local_1520 = (float *)(*in_RSI + in_RSI[8] * (long)local_2e50 * in_RSI[2]);
        iVar34 = iVar2 * iVar3;
        iVar35 = iVar34 * iVar1;
        fVar36 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
        local_2cb8 = 0;
        uStack_2cb0 = 0;
        local_2cf8 = 0;
        uStack_2cf0 = 0;
        local_2708 = 0;
        local_2718 = 0;
        uStack_2710 = 0;
        local_26f0 = local_1520;
        while( true ) {
          local_20b8 = (float)local_2718;
          fStack_20b4 = (float)((ulong)local_2718 >> 0x20);
          fStack_20b0 = (float)uStack_2710;
          fStack_20ac = (float)((ulong)uStack_2710 >> 0x20);
          if (iVar35 < local_2708 + 4) break;
          local_20c8 = (float)*(undefined8 *)local_26f0;
          fStack_20c4 = (float)((ulong)*(undefined8 *)local_26f0 >> 0x20);
          fStack_20c0 = (float)*(undefined8 *)(local_26f0 + 2);
          fStack_20bc = (float)((ulong)*(undefined8 *)(local_26f0 + 2) >> 0x20);
          local_2718 = CONCAT44(fStack_20b4 + fStack_20c4,local_20b8 + local_20c8);
          uStack_2710 = CONCAT44(fStack_20ac + fStack_20bc,fStack_20b0 + fStack_20c0);
          local_2708 = local_2708 + 4;
          local_26f0 = local_26f0 + 4;
        }
        local_272c = 0.0;
        for (; local_2708 < iVar35; local_2708 = local_2708 + 1) {
          local_272c = *local_26f0 + local_272c;
          local_26f0 = local_26f0 + 1;
        }
        if (iVar1 == 4) {
          fVar37 = (float)iVar34;
          auVar12._4_4_ = fVar37;
          auVar12._0_4_ = fVar37;
          auVar12._12_4_ = fVar37;
          auVar12._8_4_ = fVar37;
          auVar13._8_8_ = uStack_2710;
          auVar13._0_8_ = local_2718;
          auVar38 = divps(auVar13,auVar12);
          local_2748 = auVar38._0_8_;
          uStack_2740 = auVar38._8_8_;
          local_2cb8 = local_2748;
          uStack_2cb0 = uStack_2740;
        }
        if (iVar1 == 1) {
          local_2cb8._0_4_ =
               (local_20b8 + fStack_20b0 + fStack_20b4 + fStack_20ac + local_272c) / (float)iVar34;
        }
        if (iVar1 == 4) {
          local_2fe8 = local_2cb8;
          uStack_2fe0 = uStack_2cb0;
        }
        else {
          local_2fe8 = CONCAT44((float)local_2cb8,(float)local_2cb8);
          uStack_2fe0 = CONCAT44((float)local_2cb8,(float)local_2cb8);
        }
        local_24ec = 0;
        local_2508 = 0;
        uStack_2500 = 0;
        local_24b0 = local_1520;
        while( true ) {
          local_588 = (float)local_2508;
          fStack_584 = (float)((ulong)local_2508 >> 0x20);
          fStack_580 = (float)uStack_2500;
          fStack_57c = (float)((ulong)uStack_2500 >> 0x20);
          if (iVar35 < local_24ec + 4) break;
          local_b18 = (float)*(undefined8 *)local_24b0;
          fStack_b14 = (float)((ulong)*(undefined8 *)local_24b0 >> 0x20);
          fStack_b10 = (float)*(undefined8 *)(local_24b0 + 2);
          fStack_b0c = (float)((ulong)*(undefined8 *)(local_24b0 + 2) >> 0x20);
          local_b28 = (float)local_2fe8;
          fStack_b24 = (float)((ulong)local_2fe8 >> 0x20);
          fStack_b20 = (float)uStack_2fe0;
          fStack_b1c = (float)((ulong)uStack_2fe0 >> 0x20);
          local_2508 = CONCAT44((fStack_b14 - fStack_b24) * (fStack_b14 - fStack_b24) + fStack_584,
                                (local_b18 - local_b28) * (local_b18 - local_b28) + local_588);
          uStack_2500 = CONCAT44((fStack_b0c - fStack_b1c) * (fStack_b0c - fStack_b1c) + fStack_57c,
                                 (fStack_b10 - fStack_b20) * (fStack_b10 - fStack_b20) + fStack_580)
          ;
          local_24ec = local_24ec + 4;
          local_24b0 = local_24b0 + 4;
        }
        local_251c = 0.0;
        for (; local_24ec < iVar35; local_24ec = local_24ec + 1) {
          local_251c = (*local_24b0 - (float)local_2cb8) * (*local_24b0 - (float)local_2cb8) +
                       local_251c;
          local_24b0 = local_24b0 + 1;
        }
        if (iVar1 == 4) {
          fVar37 = (float)iVar34;
          auVar6._4_4_ = fVar37;
          auVar6._0_4_ = fVar37;
          auVar6._12_4_ = fVar37;
          auVar6._8_4_ = fVar37;
          auVar7._8_8_ = uStack_2500;
          auVar7._0_8_ = local_2508;
          auVar38 = divps(auVar7,auVar6);
          local_2538 = auVar38._0_8_;
          uStack_2530 = auVar38._8_8_;
          local_2cf8 = local_2538;
          uStack_2cf0 = uStack_2530;
        }
        if (iVar1 == 1) {
          local_2cf8._0_4_ =
               (local_588 + fStack_580 + fStack_584 + fStack_57c + local_251c) / (float)iVar34;
        }
        fStack_1fd0 = (float)uStack_2cf0;
        fStack_1fcc = (float)((ulong)uStack_2cf0 >> 0x20);
        if (iVar1 == 4) {
          local_1fd8 = (float)local_2cf8;
          fStack_1fd4 = (float)((ulong)local_2cf8 >> 0x20);
          local_2d48 = CONCAT44(fStack_1fd4 + fVar36,local_1fd8 + fVar36);
          uStack_2d40 = CONCAT44(fStack_1fcc + fVar36,fStack_1fd0 + fVar36);
          auVar44._8_8_ = uStack_2d40;
          auVar44._0_8_ = local_2d48;
          auVar38 = rsqrtps(in_XMM3,auVar44);
          fVar37 = (local_1fd8 + fVar36) * auVar38._0_4_;
          fVar39 = (fStack_1fd4 + fVar36) * auVar38._4_4_;
          fVar40 = (fStack_1fd0 + fVar36) * auVar38._8_4_;
          fVar41 = (fStack_1fcc + fVar36) * auVar38._12_4_;
          auVar44 = auVar44 & _DAT_01c87220;
          auVar22._4_4_ =
               -(uint)(1.1754944e-38 <= auVar44._4_4_) &
               (uint)(fVar39 * -0.5 * (fVar39 * auVar38._4_4_ + DAT_01c8b920._4_4_));
          auVar22._0_4_ =
               -(uint)(1.1754944e-38 <= auVar44._0_4_) &
               (uint)(fVar37 * -0.5 * (fVar37 * auVar38._0_4_ + (float)DAT_01c8b920));
          auVar22._12_4_ =
               -(uint)(1.1754944e-38 <= auVar44._12_4_) &
               (uint)(fVar41 * -0.5 * (fVar41 * auVar38._12_4_ + DAT_01c8b920._12_4_));
          auVar22._8_4_ =
               -(uint)(1.1754944e-38 <= auVar44._8_4_) &
               (uint)(fVar40 * -0.5 * (fVar40 * auVar38._8_4_ + DAT_01c8b920._8_4_));
          auVar23._8_8_ = 0x3f8000003f800000;
          auVar23._0_8_ = 0x3f8000003f800000;
          auVar38 = divps(auVar23,auVar22);
          local_2d18 = auVar38._0_8_;
          fStack_194 = (float)((ulong)local_2cb8 >> 0x20);
          local_1a8 = auVar38._0_4_;
          fStack_1a4 = auVar38._4_4_;
          local_2d38 = CONCAT44(0.0 - fStack_194 * fStack_1a4,0.0 - (float)local_2cb8 * local_1a8);
          local_2cf8 = local_2d18;
          local_2cb8 = local_2d38;
          in_XMM3 = _DAT_01c8b920;
        }
        if (iVar1 == 1) {
          fVar36 = 1.0 / SQRT((float)local_2cf8 + fVar36);
          local_2cf8 = CONCAT44(local_2cf8._4_4_,fVar36);
          local_2cb8 = CONCAT44(local_2cb8._4_4_,-(float)local_2cb8 * fVar36);
        }
        if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 0) {
          if (iVar1 == 4) {
            local_3008 = local_2cb8;
            uStack_3000 = uStack_2cb0;
            uVar30 = local_2cf8;
          }
          else {
            uVar30 = CONCAT44((float)local_2cf8,(float)local_2cf8);
            uStack_2cf0 = CONCAT44((float)local_2cf8,(float)local_2cf8);
            local_3008 = CONCAT44((float)local_2cb8,(float)local_2cb8);
            uStack_3000 = CONCAT44((float)local_2cb8,(float)local_2cb8);
          }
          local_1120 = local_1520;
          for (local_116c = 0; local_116c + 4 <= iVar35; local_116c = local_116c + 4) {
            local_1b8 = (float)*(undefined8 *)local_1120;
            fStack_1b4 = (float)((ulong)*(undefined8 *)local_1120 >> 0x20);
            fStack_1b0 = (float)*(undefined8 *)(local_1120 + 2);
            fStack_1ac = (float)((ulong)*(undefined8 *)(local_1120 + 2) >> 0x20);
            local_1c8 = (float)uVar30;
            fStack_1c4 = (float)((ulong)uVar30 >> 0x20);
            fStack_1c0 = (float)uStack_2cf0;
            fStack_1bc = (float)((ulong)uStack_2cf0 >> 0x20);
            local_a88 = (float)local_3008;
            fStack_a84 = (float)((ulong)local_3008 >> 0x20);
            fStack_a80 = (float)uStack_3000;
            fStack_a7c = (float)((ulong)uStack_3000 >> 0x20);
            local_1188 = CONCAT44(fStack_1b4 * fStack_1c4 + fStack_a84,
                                  local_1b8 * local_1c8 + local_a88);
            uStack_1180 = CONCAT44(fStack_1ac * fStack_1bc + fStack_a7c,
                                   fStack_1b0 * fStack_1c0 + fStack_a80);
            *(undefined8 *)local_1120 = local_1188;
            *(undefined8 *)(local_1120 + 2) = uStack_1180;
            local_1120 = local_1120 + 4;
          }
          for (; local_116c < iVar35; local_116c = local_116c + 1) {
            *local_1120 = *local_1120 * (float)local_2cf8 + (float)local_2cb8;
            local_1120 = local_1120 + 1;
          }
        }
        else {
          local_1540 = pfVar5;
          local_1538 = pfVar4;
          if (iVar1 == 4) {
            for (local_154c = 0; local_154c + 4 <= iVar35; local_154c = local_154c + 4) {
              fVar36 = *local_1538;
              fVar37 = *local_1540;
              local_258 = (float)*(undefined8 *)local_1520;
              fStack_254 = (float)((ulong)*(undefined8 *)local_1520 >> 0x20);
              fStack_250 = (float)*(undefined8 *)(local_1520 + 2);
              fStack_24c = (float)((ulong)*(undefined8 *)(local_1520 + 2) >> 0x20);
              fStack_264 = (float)((ulong)local_2cf8 >> 0x20);
              fStack_944 = (float)((ulong)local_2cb8 >> 0x20);
              fStack_940 = (float)uStack_2cb0;
              fStack_93c = (float)((ulong)uStack_2cb0 >> 0x20);
              local_1588 = CONCAT44((fStack_254 * fStack_264 + fStack_944) * fVar36 + fVar37,
                                    (local_258 * (float)local_2cf8 + (float)local_2cb8) * fVar36 +
                                    fVar37);
              uStack_1580 = CONCAT44((fStack_24c * fStack_1fcc + fStack_93c) * fVar36 + fVar37,
                                     (fStack_250 * fStack_1fd0 + fStack_940) * fVar36 + fVar37);
              *(undefined8 *)local_1520 = local_1588;
              *(undefined8 *)(local_1520 + 2) = uStack_1580;
              local_1520 = local_1520 + 4;
              local_1538 = local_1538 + 1;
              local_1540 = local_1540 + 1;
            }
          }
          if (iVar1 == 1) {
            for (local_15ac = 0; local_15ac + 4 <= iVar35; local_15ac = local_15ac + 4) {
              local_298 = (float)*(undefined8 *)local_1520;
              fStack_294 = (float)((ulong)*(undefined8 *)local_1520 >> 0x20);
              fStack_290 = (float)*(undefined8 *)(local_1520 + 2);
              fStack_28c = (float)((ulong)*(undefined8 *)(local_1520 + 2) >> 0x20);
              local_288 = (float)*(undefined8 *)local_1538;
              fStack_284 = (float)((ulong)*(undefined8 *)local_1538 >> 0x20);
              fStack_280 = (float)*(undefined8 *)(local_1538 + 2);
              fStack_27c = (float)((ulong)*(undefined8 *)(local_1538 + 2) >> 0x20);
              local_908 = (float)*(undefined8 *)local_1540;
              fStack_904 = (float)((ulong)*(undefined8 *)local_1540 >> 0x20);
              fStack_900 = (float)*(undefined8 *)(local_1540 + 2);
              fStack_8fc = (float)((ulong)*(undefined8 *)(local_1540 + 2) >> 0x20);
              local_15e8 = CONCAT44((fStack_294 * (float)local_2cf8 + (float)local_2cb8) *
                                    fStack_284 + fStack_904,
                                    (local_298 * (float)local_2cf8 + (float)local_2cb8) * local_288
                                    + local_908);
              uStack_15e0 = CONCAT44((fStack_28c * (float)local_2cf8 + (float)local_2cb8) *
                                     fStack_27c + fStack_8fc,
                                     (fStack_290 * (float)local_2cf8 + (float)local_2cb8) *
                                     fStack_280 + fStack_900);
              *(undefined8 *)local_1520 = local_15e8;
              *(undefined8 *)(local_1520 + 2) = uStack_15e0;
              local_1520 = local_1520 + 4;
              local_1538 = local_1538 + 4;
              local_1540 = local_1540 + 4;
            }
            for (; local_15ac < iVar35; local_15ac = local_15ac + 1) {
              *local_1520 = (*local_1520 * (float)local_2cf8 + (float)local_2cb8) * *local_1538 +
                            *local_1540;
              local_1520 = local_1520 + 1;
              local_1538 = local_1538 + 1;
              local_1540 = local_1540 + 1;
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int LayerNorm_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int elempack = bottom_top_blob.elempack;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;

    const float* gamma = gamma_data;
    const float* beta = beta_data;

    if (dims == 1)
    {
        int elemcount = w * elempack;
        float* ptr = bottom_top_blob;
        // 1D layer norm is special. Treat them as unpacked.
        fast_1d_layer_norm(ptr, 1, elemcount, elemcount, gamma, beta, affine, eps);
    }

    if (dims == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; ++i)
        {
            float* ptr = bottom_top_blob.row(i);
            fast_1d_layer_norm(ptr, elempack, w, w * elempack, gamma, beta, affine, eps);
        }
    }

    if (dims == 3)
    {
        if (affine_size == w)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; ++q)
            {
                for (int i = 0; i < h; ++i)
                {
                    float* ptr = bottom_top_blob.channel(q).row(i);
                    fast_1d_layer_norm(ptr, elempack, w, w * elempack, gamma, beta, affine, eps);
                }
            }
        }
        else // if (affine_size == w * h)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; ++q)
            {
                float* ptr = bottom_top_blob.channel(q);
                fast_1d_layer_norm(ptr, elempack, w * h, w * h * elempack, gamma, beta, affine, eps);
            }
        }
    }

    return 0;
}